

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapLookup(jx9_hashmap *pMap,jx9_value *pKey,jx9_hashmap_node **ppNode)

{
  int local_34;
  jx9_hashmap_node *pjStack_30;
  sxi32 rc;
  jx9_hashmap_node *pNode;
  jx9_hashmap_node **ppNode_local;
  jx9_value *pKey_local;
  jx9_hashmap *pMap_local;
  
  pjStack_30 = (jx9_hashmap_node *)0x0;
  pNode = (jx9_hashmap_node *)ppNode;
  ppNode_local = (jx9_hashmap_node **)pKey;
  pKey_local = (jx9_value *)pMap;
  if ((pKey->iFlags & 0x141U) != 0) {
    if ((pKey->iFlags & 1U) == 0) {
      jx9MemObjToString(pKey);
    }
    if (*(int *)(ppNode_local + 5) != 0) {
      local_34 = HashmapLookupBlobKey
                           ((jx9_hashmap *)pKey_local,ppNode_local[4],*(sxu32 *)(ppNode_local + 5),
                            &stack0xffffffffffffffd0);
      goto LAB_0012e2f1;
    }
  }
  if (((ulong)ppNode_local[1] & 2) == 0) {
    jx9MemObjToInteger((jx9_value *)ppNode_local);
  }
  local_34 = HashmapLookupIntKey((jx9_hashmap *)pKey_local,(sxi64)*ppNode_local,
                                 &stack0xffffffffffffffd0);
LAB_0012e2f1:
  if (local_34 == 0) {
    if (pNode != (jx9_hashmap_node *)0x0) {
      pNode->pMap = (jx9_hashmap *)pjStack_30;
    }
    pMap_local._4_4_ = 0;
  }
  else {
    pMap_local._4_4_ = -6;
  }
  return pMap_local._4_4_;
}

Assistant:

static sxi32 HashmapLookup(
	jx9_hashmap *pMap,          /* Target hashmap */
	jx9_value *pKey,            /* Lookup key */
	jx9_hashmap_node **ppNode   /* OUT: target node on success */
	)
{
	jx9_hashmap_node *pNode = 0; /* cc -O6 warning */
	sxi32 rc;
	if( pKey->iFlags & (MEMOBJ_STRING|MEMOBJ_HASHMAP|MEMOBJ_RES) ){
		if( (pKey->iFlags & MEMOBJ_STRING) == 0 ){
			/* Force a string cast */
			jx9MemObjToString(&(*pKey));
		}
		if( SyBlobLength(&pKey->sBlob) > 0 ){
			/* Perform a blob lookup */
			rc = HashmapLookupBlobKey(&(*pMap), SyBlobData(&pKey->sBlob), SyBlobLength(&pKey->sBlob), &pNode);
			goto result;
		}
	}
	/* Perform an int lookup */
	if((pKey->iFlags & MEMOBJ_INT) == 0 ){
		/* Force an integer cast */
		jx9MemObjToInteger(pKey);
	}
	/* Perform an int lookup */
	rc = HashmapLookupIntKey(&(*pMap), pKey->x.iVal, &pNode);
result:
	if( rc == SXRET_OK ){
		/* Node found */
		if( ppNode ){
			*ppNode = pNode;
		}
		return SXRET_OK;
	}
	/* No such entry */
	return SXERR_NOTFOUND;
}